

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O1

void shared_strings_callback_find_shared_string_end(void *callbackdata,XML_Char *name)

{
  int iVar1;
  
  iVar1 = strcasecmp(name,"t");
  if (iVar1 != 0) {
    shared_strings_callback_find_shared_stringitem_end(callbackdata,name);
    return;
  }
  XML_SetElementHandler
            (*callbackdata,shared_strings_callback_find_shared_string_start,
             shared_strings_callback_find_shared_stringitem_end);
  XML_SetCharacterDataHandler(*callbackdata,0);
  return;
}

Assistant:

void shared_strings_callback_find_shared_string_end (void* callbackdata, const XML_Char* name)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if (XML_Char_icmp(name, X("t")) == 0) {
    XML_SetElementHandler(data->xmlparser, shared_strings_callback_find_shared_string_start, shared_strings_callback_find_shared_stringitem_end);
    XML_SetCharacterDataHandler(data->xmlparser, NULL);
  } else {
    shared_strings_callback_find_shared_stringitem_end(callbackdata, name);
  }
}